

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_BMP_Image.cxx
# Opt level: O1

int read_long(FILE *fp)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  
  uVar1 = getc((FILE *)fp);
  uVar2 = getc((FILE *)fp);
  uVar3 = getc((FILE *)fp);
  iVar4 = getc((FILE *)fp);
  return iVar4 << 0x18 | (uVar3 & 0xff) << 0x10 | (uVar2 & 0xff) << 8 | uVar1 & 0xff;
}

Assistant:

static int			// O - 32-bit signed integer
read_long(FILE *fp) {		// I - File to read from
  unsigned char b0, b1, b2, b3;	// Bytes from file

  b0 = (uchar)getc(fp);
  b1 = (uchar)getc(fp);
  b2 = (uchar)getc(fp);
  b3 = (uchar)getc(fp);

  return ((int)(((((b3 << 8) | b2) << 8) | b1) << 8) | b0);
}